

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O0

void ppu_handle_lyc(gb_ppu_t *ppu)

{
  gb_ppu_t *ppu_local;
  
  if (ppu->reg_ly == ppu->reg_lyc) {
    ppu->reg_stat = ppu->reg_stat & 0xfb | 4;
    if ((((int)(uint)ppu->reg_stat >> 6 & 1U) != 0) && ((ppu->lcdc_blocked & 1U) == 0)) {
      int_request(&ppu->gb->intr_ctrl,INT_LCDC);
      ppu->lcdc_blocked = true;
    }
  }
  else {
    ppu->reg_stat = ppu->reg_stat & 0xfb;
  }
  return;
}

Assistant:

static void ppu_handle_lyc(gb_ppu_t *ppu)
{
    if (ppu->reg_ly == ppu->reg_lyc)
    {
        SET_BIT(ppu->reg_stat, STAT_LYC_FLAG_BIT, 1);

        if (GET_BIT(ppu->reg_stat, STAT_LYC_INT_BIT) && !ppu->lcdc_blocked)
        {
            int_request(&ppu->gb->intr_ctrl, INT_LCDC);
            ppu->lcdc_blocked = true;
        }
    }
    else
        SET_BIT(ppu->reg_stat, STAT_LYC_FLAG_BIT, 0);
}